

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# repeated_field.h
# Opt level: O1

int __thiscall google::protobuf::internal::SooRep::size(SooRep *this,bool is_soo)

{
  ulong uVar1;
  uint uVar2;
  int iVar3;
  string *psVar4;
  char *pcVar5;
  LongSooRep *this_00;
  LongSooRep local_20;
  
  uVar1 = (this->field_0).long_rep.elements_int;
  if (((uVar1 & 4) == 0) == is_soo) {
    psVar4 = (string *)0x0;
  }
  else {
    psVar4 = absl::lts_20240722::log_internal::MakeCheckOpString<bool,bool>
                       (is_soo,(uVar1 & 4) == 0,"is_soo == this->is_soo()");
  }
  if (psVar4 != (string *)0x0) {
    this_00 = &local_20;
    size();
    iVar3 = size((SooRep *)this_00,(this_00->elements_int & 4) == 0);
    if (((this_00->elements_int & 4) != 0) && (iVar3 != this_00->capacity)) {
      pcVar5 = LongSooRep::elements(this_00);
      return (int)pcVar5;
    }
    return iVar3;
  }
  if (is_soo) {
    uVar2 = *(uint *)&this->field_0 & 3;
  }
  else {
    uVar2 = (this->field_0).long_rep.size;
  }
  return uVar2;
}

Assistant:

int size(bool is_soo) const {
    ABSL_DCHECK_EQ(is_soo, this->is_soo());
#if !defined(__clang__) && defined(__GNUC__)
#pragma GCC diagnostic push
#pragma GCC diagnostic ignored "-Wmaybe-uninitialized"
#endif
    return is_soo ? short_rep.size() : long_rep.size;
#if !defined(__clang__) && defined(__GNUC__)
#pragma GCC diagnostic pop
#endif
  }